

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O2

void __thiscall
AEADChaCha20Poly1305::Encrypt
          (AEADChaCha20Poly1305 *this,Span<const_std::byte> plain1,Span<const_std::byte> plain2,
          Span<const_std::byte> aad,Nonce96 nonce,Span<std::byte> cipher)

{
  long lVar1;
  Span<std::byte> tag;
  size_t sVar2;
  long in_FS_OFFSET;
  Span<std::byte> output;
  Span<std::byte> output_00;
  Span<const_std::byte> cipher_00;
  Nonce96 nonce_00;
  Nonce96 nonce_01;
  
  sVar2 = plain1.m_size;
  output_00.m_size = plain2.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (cipher.m_size != sVar2 + output_00.m_size + 0x10) {
    __assert_fail("cipher.size() == plain1.size() + plain2.size() + EXPANSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20poly1305.cpp"
                  ,0x47,
                  "void AEADChaCha20Poly1305::Encrypt(Span<const std::byte>, Span<const std::byte>, Span<const std::byte>, Nonce96, Span<std::byte>)"
                 );
  }
  nonce_00._4_4_ = 0;
  nonce_00.first = nonce.first;
  nonce_00.second = nonce.second;
  ChaCha20::Seek(&this->m_chacha20,nonce_00,1);
  output.m_size = sVar2;
  output.m_data = cipher.m_data;
  ChaCha20::Crypt(&this->m_chacha20,plain1,output);
  output_00.m_data = cipher.m_data + sVar2;
  ChaCha20::Crypt(&this->m_chacha20,plain2,output_00);
  nonce_01._4_4_ = 0;
  nonce_01.first = nonce.first;
  nonce_01.second = nonce.second;
  ChaCha20::Seek(&this->m_chacha20,nonce_01,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    tag.m_size = 0x10;
    tag.m_data = cipher.m_data + (cipher.m_size - 0x10);
    cipher_00.m_size = cipher.m_size - 0x10;
    cipher_00.m_data = cipher.m_data;
    anon_unknown.dwarf_23e1e35::ComputeTag(&this->m_chacha20,aad,cipher_00,tag);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AEADChaCha20Poly1305::Encrypt(Span<const std::byte> plain1, Span<const std::byte> plain2, Span<const std::byte> aad, Nonce96 nonce, Span<std::byte> cipher) noexcept
{
    assert(cipher.size() == plain1.size() + plain2.size() + EXPANSION);

    // Encrypt using ChaCha20 (starting at block 1).
    m_chacha20.Seek(nonce, 1);
    m_chacha20.Crypt(plain1, cipher.first(plain1.size()));
    m_chacha20.Crypt(plain2, cipher.subspan(plain1.size()).first(plain2.size()));

    // Seek to block 0, and compute tag using key drawn from there.
    m_chacha20.Seek(nonce, 0);
    ComputeTag(m_chacha20, aad, cipher.first(cipher.size() - EXPANSION), cipher.last(EXPANSION));
}